

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Instr * __thiscall
Inline::InlinePolymorphicFunctionUsingFixedMethods
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,StackSym *symCallerThis,
          ProfileId profileId,PropertySymOpnd *methodValueOpnd,bool *pIsInlined,
          uint recursiveInlineDepth)

{
  Func *pFVar1;
  code *pcVar2;
  AddrOpnd *pAVar3;
  LabelInstr *pLVar4;
  bool bVar5;
  ArgSlot AVar6;
  uint16 cachedFixedInlineeCount_00;
  uint uVar7;
  Instr *pIVar8;
  undefined4 *puVar9;
  FunctionJITTimeInfo *pFVar10;
  JITTimeFunctionBody *pJVar11;
  char16 *pcVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  Opnd *pOVar16;
  RegOpnd *pRVar17;
  StackSym *pSVar18;
  Instr *this_00;
  SymOpnd *pSVar19;
  PropertySymOpnd *this_01;
  FixedFieldInfo *fixedFunctionInfoArray_00;
  intptr_t iVar20;
  FixedFieldInfo *pFVar21;
  intptr_t iVar22;
  FunctionJITRuntimeInfo *inlineeRuntimeData;
  JITType *pJVar23;
  AddrOpnd *pAVar24;
  BranchInstr *pBVar25;
  JITTypeHolder typeRef;
  JITTypeHolderBase<void> local_200;
  Type local_1f8;
  JITTypeHolderBase<void> local_1f0;
  AddrOpnd *local_1e8;
  AddrOpnd *constMethodValueOpnd;
  LabelInstr *inlineeStartLabel;
  LabelInstr *pLStack_1d0;
  uint i_3;
  Instr *dispatchStartLabel;
  LabelInstr *doneLabel;
  RegOpnd *returnValueOpnd;
  JITTimeFunctionBody *inlineeFunctionBody;
  Instr *pIStack_1a8;
  uint i_2;
  Instr *propertyGuardCheckInstr;
  RegOpnd *typeOpnd;
  TypeId typeId;
  uint i_1;
  bool safeThis;
  FunctionJITTimeInfo *local_188;
  uint i;
  FunctionJITTimeInfo *inlineesDataArray [4];
  uint uniqueFixedFunctionCount;
  FixedFieldInfo *fixedFunctionInfoArray;
  uint16 cachedFixedInlineeCount;
  PropertySymOpnd *methodPropertyOpnd;
  Instr *ldMethodFldInstr;
  StackSym *methodValueSym;
  Instr *tmpInstr;
  FunctionJITTimeInfo *tmpInlineeJitTimeData;
  wchar local_118 [2];
  uint inlineeCount;
  char16 debugStringBuffer2 [42];
  wchar local_b8 [4];
  char16 debugStringBuffer [42];
  FunctionJITTimeInfo *inlineeJitTimeData;
  Instr *instrNext;
  PropertySymOpnd *methodValueOpnd_local;
  ProfileId profileId_local;
  StackSym *symCallerThis_local;
  FunctionJITTimeInfo *inlinerData_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  this_local = (Inline *)callInstr->m_next;
  *pIsInlined = false;
  pIVar8 = (Instr *)FunctionJITTimeInfo::GetInlinee(inlinerData,profileId);
  if (pIVar8 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x2d5,"(inlineeJitTimeData)","inlineeJitTimeData");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pFVar10 = FunctionJITTimeInfo::GetNext((FunctionJITTimeInfo *)pIVar8);
  if (pFVar10 == (FunctionJITTimeInfo *)0x0) {
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
    if (bVar5) {
      pJVar11 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pIVar8);
      pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
      pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                          ((FunctionJITTimeInfo *)pIVar8,(wchar (*) [42])local_b8);
      pJVar11 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
      pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_118);
      Output::Print(L"INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"
                    ,pcVar12,pcVar13,pcVar14,pcVar15);
      Output::Flush();
    }
    TryResetObjTypeSpecFldInfoOn(this,methodValueOpnd);
    TryDisableRuntimePolymorphicCacheOn(this,methodValueOpnd);
  }
  else {
    pOVar16 = IR::Instr::GetSrc2(callInstr);
    if (pOVar16 != (Opnd *)0x0) {
      pOVar16 = IR::Instr::GetSrc2(callInstr);
      bVar5 = IR::Opnd::IsSymOpnd(pOVar16);
      if (bVar5) {
        pOVar16 = IR::Instr::GetSrc2(callInstr);
        pSVar19 = IR::Opnd::AsSymOpnd(pOVar16);
        pSVar18 = Sym::AsStackSym(pSVar19->m_sym);
        AVar6 = StackSym::GetArgSlotNum(pSVar18);
        if (0xf < AVar6) {
          bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
          if (bVar5) {
            pJVar11 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pIVar8);
            pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
            pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                                ((FunctionJITTimeInfo *)pIVar8,(wchar (*) [42])local_b8);
            pOVar16 = IR::Instr::GetSrc2(callInstr);
            pSVar19 = IR::Opnd::AsSymOpnd(pOVar16);
            pSVar18 = Sym::AsStackSym(pSVar19->m_sym);
            AVar6 = StackSym::GetArgSlotNum(pSVar18);
            pJVar11 = FunctionJITTimeInfo::GetBody(inlinerData);
            pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
            pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_118);
            Output::Print(L"INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"
                          ,pcVar12,pcVar13,(ulong)AVar6,0xf,pcVar14,pcVar15);
            Output::Flush();
          }
          TryResetObjTypeSpecFldInfoOn(this,methodValueOpnd);
          TryDisableRuntimePolymorphicCacheOn(this,methodValueOpnd);
          return (Instr *)this_local;
        }
      }
    }
    tmpInlineeJitTimeData._4_4_ = 0;
    for (tmpInstr = pIVar8; tmpInstr != (Instr *)0x0;
        tmpInstr = (Instr *)FunctionJITTimeInfo::GetNext((FunctionJITTimeInfo *)tmpInstr)) {
      tmpInlineeJitTimeData._4_4_ = tmpInlineeJitTimeData._4_4_ + 1;
    }
    if ((tmpInlineeJitTimeData._4_4_ < 2) || (4 < tmpInlineeJitTimeData._4_4_)) {
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
      if (bVar5) {
        pJVar11 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pIVar8);
        pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
        pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                            ((FunctionJITTimeInfo *)pIVar8,(wchar (*) [42])local_b8);
        pJVar11 = FunctionJITTimeInfo::GetBody(inlinerData);
        pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
        pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_118);
        Output::Print(L"INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large: InlineeCount %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                      ,(ulong)tmpInlineeJitTimeData._4_4_,4,pcVar12,pcVar13,pcVar14,pcVar15);
        Output::Flush();
      }
      TryResetObjTypeSpecFldInfoOn(this,methodValueOpnd);
      TryDisableRuntimePolymorphicCacheOn(this,methodValueOpnd);
    }
    else {
      *pIsInlined = true;
      for (methodValueSym = (StackSym *)callInstr->m_prev;
          *(short *)&methodValueSym->m_tempNumberSym != 7;
          methodValueSym = *(StackSym **)&methodValueSym->field_0x18) {
        if ((*(short *)&methodValueSym->m_tempNumberSym != 0x59) &&
           (*(short *)&methodValueSym->m_tempNumberSym != 0x45)) {
          bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
          if (bVar5) {
            pJVar11 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pIVar8);
            pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
            pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                                ((FunctionJITTimeInfo *)pIVar8,(wchar (*) [42])local_b8);
            pJVar11 = FunctionJITTimeInfo::GetBody(inlinerData);
            pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
            pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_118);
            Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ArgOuts may have side effects Inlinee: %s (%s):\tCaller: %s (%s)\n"
                          ,pcVar12,pcVar13,pcVar14,pcVar15);
            Output::Flush();
          }
          pIVar8 = InlinePolymorphicFunction
                             (this,callInstr,inlinerData,symCallerThis,profileId,pIsInlined,
                              recursiveInlineDepth,true);
          return pIVar8;
        }
      }
      pOVar16 = IR::Instr::GetSrc1(callInstr);
      pRVar17 = IR::Opnd::AsRegOpnd(pOVar16);
      pSVar18 = Sym::AsStackSym(&pRVar17->m_sym->super_Sym);
      bVar5 = StackSym::IsSingleDef(pSVar18);
      if (bVar5) {
        this_00 = StackSym::GetInstrDef(pSVar18);
        pOVar16 = IR::Instr::GetSrc1(this_00);
        bVar5 = IR::Opnd::IsSymOpnd(pOVar16);
        if (bVar5) {
          pOVar16 = IR::Instr::GetSrc1(this_00);
          pSVar19 = IR::Opnd::AsSymOpnd(pOVar16);
          bVar5 = IR::SymOpnd::IsPropertySymOpnd(pSVar19);
          if (bVar5) {
            pOVar16 = IR::Instr::GetSrc1(this_00);
            this_01 = IR::Opnd::AsPropertySymOpnd(pOVar16);
            bVar5 = IR::PropertySymOpnd::HasObjTypeSpecFldInfo(this_01);
            if (!bVar5) {
              bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
              if (bVar5) {
                pJVar11 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pIVar8);
                pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                                    ((FunctionJITTimeInfo *)pIVar8,(wchar (*) [42])local_b8);
                pJVar11 = FunctionJITTimeInfo::GetBody(inlinerData);
                pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                                    (inlinerData,(wchar (*) [42])local_118);
                Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no ObjTypeSpecFldInfo to get Fixed Methods from Inlinee: %s (%s):\tCaller: %s (%s)\n"
                              ,pcVar12,pcVar13,pcVar14,pcVar15);
                Output::Flush();
              }
              pIVar8 = InlinePolymorphicFunction
                                 (this,callInstr,inlinerData,symCallerThis,profileId,pIsInlined,
                                  recursiveInlineDepth,true);
              return pIVar8;
            }
            bVar5 = IR::PropertySymOpnd::HasFixedValue(this_01);
            if (!bVar5) {
              bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
              if (bVar5) {
                pJVar11 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pIVar8);
                pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                                    ((FunctionJITTimeInfo *)pIVar8,(wchar (*) [42])local_b8);
                pJVar11 = FunctionJITTimeInfo::GetBody(inlinerData);
                pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                                    (inlinerData,(wchar (*) [42])local_118);
                Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ObjTypeSpecFldInfo doesn\'t have Fixed Methods for one or some of the inlinees Inlinee: %s (%s):\tCaller: %s (%s)\n"
                              ,pcVar12,pcVar13,pcVar14,pcVar15);
                Output::Flush();
              }
              pIVar8 = InlinePolymorphicFunction
                                 (this,callInstr,inlinerData,symCallerThis,profileId,pIsInlined,
                                  recursiveInlineDepth,true);
              return pIVar8;
            }
            cachedFixedInlineeCount_00 = IR::PropertySymOpnd::GetFixedFieldCount(this_01);
            if (cachedFixedInlineeCount_00 < 2) {
              bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
              if (bVar5) {
                pJVar11 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pIVar8);
                pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                                    ((FunctionJITTimeInfo *)pIVar8,(wchar (*) [42])local_b8);
                pJVar11 = FunctionJITTimeInfo::GetBody(inlinerData);
                pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                                    (inlinerData,(wchar (*) [42])local_118);
                Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: fixed function count too less %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                              ,(ulong)cachedFixedInlineeCount_00,4,pcVar12,pcVar13,pcVar14,pcVar15);
                Output::Flush();
              }
              pIVar8 = InlinePolymorphicFunction
                                 (this,callInstr,inlinerData,symCallerThis,profileId,pIsInlined,
                                  recursiveInlineDepth,true);
              return pIVar8;
            }
            fixedFunctionInfoArray_00 = IR::PropertySymOpnd::GetFixedFieldInfoArray(this_01);
            uVar7 = HandleDifferentTypesSameFunction
                              (this,fixedFunctionInfoArray_00,cachedFixedInlineeCount_00);
            if (uVar7 != tmpInlineeJitTimeData._4_4_) {
              bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
              if (bVar5) {
                pJVar11 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pIVar8);
                pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                                    ((FunctionJITTimeInfo *)pIVar8,(wchar (*) [42])local_b8);
                pJVar11 = FunctionJITTimeInfo::GetBody(inlinerData);
                pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                                    (inlinerData,(wchar (*) [42])local_118);
                Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: cached fixed function count (%d) doesn\'t match inlinee count (%d); (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                              ,(ulong)uVar7,(ulong)tmpInlineeJitTimeData._4_4_,4,pcVar12,pcVar13,
                              pcVar14,pcVar15);
                Output::Flush();
              }
              pIVar8 = InlinePolymorphicFunction
                                 (this,callInstr,inlinerData,symCallerThis,profileId,pIsInlined,
                                  recursiveInlineDepth,true);
              return pIVar8;
            }
            if (4 < cachedFixedInlineeCount_00) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar9 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x359,
                                 "(cachedFixedInlineeCount <= Js::DynamicProfileInfo::maxPolymorphicInliningSize)"
                                 ,
                                 "cachedFixedInlineeCount <= Js::DynamicProfileInfo::maxPolymorphicInliningSize"
                                );
              if (!bVar5) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar9 = 0;
            }
            memset(&stack0xfffffffffffffe78,0,0x20);
            FillInlineesDataArrayUsingFixedMethods
                      (this,(FunctionJITTimeInfo *)pIVar8,&stack0xfffffffffffffe78,4,
                       fixedFunctionInfoArray_00,cachedFixedInlineeCount_00);
            i_1 = 0;
            while( true ) {
              if (cachedFixedInlineeCount_00 <= i_1) {
                typeId._3_1_ = 1;
                for (typeOpnd._4_4_ = 0; typeOpnd._4_4_ < cachedFixedInlineeCount_00;
                    typeOpnd._4_4_ = typeOpnd._4_4_ + 1) {
                  iVar20 = IR::PropertySymOpnd::GetFieldValue(this_01,typeOpnd._4_4_);
                  if (iVar20 == 0) {
                    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
                    if (bVar5) {
                      pJVar11 = FunctionJITTimeInfo::GetBody
                                          (inlineesDataArray[(ulong)typeOpnd._4_4_ - 1]);
                      pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                      pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                                          (inlineesDataArray[(ulong)typeOpnd._4_4_ - 1],
                                           (wchar (*) [42])local_b8);
                      pJVar11 = FunctionJITTimeInfo::GetBody(inlinerData);
                      pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                      pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                                          (inlinerData,(wchar (*) [42])local_118);
                      Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no fixed method for one of the inlinees; Inlinee: %s (%s):\tCaller: %s (%s)\n"
                                    ,pcVar12,pcVar13,pcVar14,pcVar15);
                      Output::Flush();
                    }
                    pIVar8 = InlinePolymorphicFunction
                                       (this,callInstr,inlinerData,symCallerThis,profileId,
                                        pIsInlined,recursiveInlineDepth,true);
                    return pIVar8;
                  }
                  if (typeOpnd._4_4_ == 0) {
                    bVar5 = TryOptimizeCallInstrWithFixedMethod
                                      (this,callInstr,local_188,true,false,false,true,
                                       (bool *)((long)&typeId + 3),true,0);
                    if (!bVar5) {
                      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
                      if (bVar5) {
                        pJVar11 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pIVar8);
                        pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                        pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                                            ((FunctionJITTimeInfo *)pIVar8,(wchar (*) [42])local_b8)
                        ;
                        pJVar11 = FunctionJITTimeInfo::GetBody(inlinerData);
                        pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                        pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                                            (inlinerData,(wchar (*) [42])local_118);
                        Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: can\'t optimize using Fixed Methods %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                                      ,(ulong)tmpInlineeJitTimeData._4_4_,4,pcVar12,pcVar13,pcVar14,
                                      pcVar15);
                        Output::Flush();
                      }
                      pIVar8 = InlinePolymorphicFunction
                                         (this,callInstr,inlinerData,symCallerThis,profileId,
                                          pIsInlined,recursiveInlineDepth,true);
                      return pIVar8;
                    }
                  }
                  else {
                    pFVar21 = IR::PropertySymOpnd::GetFixedFunction(this_01,typeOpnd._4_4_);
                    if (pFVar21 != (FixedFieldInfo *)0x0) {
                      pFVar21 = IR::PropertySymOpnd::GetFixedFunction(this_01,typeOpnd._4_4_);
                      iVar20 = FixedFieldInfo::GetFuncInfoAddr(pFVar21);
                      iVar22 = FunctionJITTimeInfo::GetFunctionInfoAddr
                                         (inlineesDataArray[(ulong)typeOpnd._4_4_ - 1]);
                      if (iVar20 != iVar22) {
                        bVar5 = Js::Phases::IsEnabled
                                          ((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
                        if (bVar5) {
                          pJVar11 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pIVar8);
                          pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                          pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                                              ((FunctionJITTimeInfo *)pIVar8,
                                               (wchar (*) [42])local_b8);
                          pJVar11 = FunctionJITTimeInfo::GetBody(inlinerData);
                          pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                          pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                                              (inlinerData,(wchar (*) [42])local_118);
                          Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: can\'t optimize using Fixed Methods %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                                        ,(ulong)tmpInlineeJitTimeData._4_4_,4,pcVar12,pcVar13,
                                        pcVar14,pcVar15);
                          Output::Flush();
                        }
                        pIVar8 = InlinePolymorphicFunction
                                           (this,callInstr,inlinerData,symCallerThis,profileId,
                                            pIsInlined,recursiveInlineDepth,true);
                        return pIVar8;
                      }
                    }
                  }
                  typeOpnd._0_4_ = IR::PropertySymOpnd::GetTypeId(this_01,typeOpnd._4_4_);
                  if (((int)(TypeId)typeOpnd < 0x17) || (0x51 < (int)(TypeId)typeOpnd)) {
                    typeId._3_1_ = TypeIds_Undefined >> 0x18;
                  }
                  while (bVar5 = FixedFieldInfo::NextHasSameFixedField
                                           (fixedFunctionInfoArray_00 + typeOpnd._4_4_), bVar5) {
                    typeOpnd._4_4_ = typeOpnd._4_4_ + 1;
                  }
                }
                bVar5 = IR::PropertySymOpnd::IsPoly(this_01);
                if (!bVar5) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 1;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                     ,0x3a0,"(methodPropertyOpnd->IsPoly())",
                                     "methodPropertyOpnd->IsPoly()");
                  if (!bVar5) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 0;
                }
                pIVar8 = (Instr *)IR::RegOpnd::New(TyVar,callInstr->m_func);
                propertyGuardCheckInstr = pIVar8;
                pOVar16 = IR::Instr::GetSrc1(this_00);
                pIStack_1a8 = IR::Instr::New(CheckPropertyGuardAndLoadType,(Opnd *)pIVar8,pOVar16,
                                             callInstr->m_func);
                IR::Instr::InsertBefore(this_00,pIStack_1a8);
                IR::Instr::SetByteCodeOffset(pIStack_1a8,this_00);
                pIStack_1a8 = IR::Instr::ConvertToBailOutInstr
                                        (pIStack_1a8,this_00,BailOutFailedFixedFieldCheck,0xffffffff
                                        );
                bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
                if (bVar5) {
                  Output::Print(L"------------------------------------------------\n");
                  Output::Flush();
                }
                for (inlineeFunctionBody._4_4_ = 0;
                    inlineeFunctionBody._4_4_ < cachedFixedInlineeCount_00;
                    inlineeFunctionBody._4_4_ = inlineeFunctionBody._4_4_ + 1) {
                  returnValueOpnd =
                       (RegOpnd *)
                       FunctionJITTimeInfo::GetBody
                                 (inlineesDataArray[(ulong)inlineeFunctionBody._4_4_ - 1]);
                  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
                  if (bVar5) {
                    pcVar12 = JITTimeFunctionBody::GetDisplayName
                                        ((JITTimeFunctionBody *)returnValueOpnd);
                    pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                                        (inlineesDataArray[(ulong)inlineeFunctionBody._4_4_ - 1],
                                         (wchar (*) [42])local_b8);
                    pJVar11 = FunctionJITTimeInfo::GetBody(inlinerData);
                    pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                    pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                                        (inlinerData,(wchar (*) [42])local_118);
                    Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Start inlining: \tInlinee: %s (%s):\tCaller: %s (%s)\n"
                                  ,pcVar12,pcVar13,pcVar14,pcVar15);
                    Output::Flush();
                  }
                  while (bVar5 = FixedFieldInfo::NextHasSameFixedField
                                           (fixedFunctionInfoArray_00 + inlineeFunctionBody._4_4_),
                        bVar5) {
                    inlineeFunctionBody._4_4_ = inlineeFunctionBody._4_4_ + 1;
                  }
                }
                bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
                if (bVar5) {
                  Output::Print(L"------------------------------------------------\n");
                  Output::Flush();
                }
                pOVar16 = IR::Instr::GetDst(callInstr);
                if (pOVar16 == (Opnd *)0x0) {
                  doneLabel = (LabelInstr *)0x0;
                }
                else {
                  pOVar16 = IR::Instr::UnlinkDst(callInstr);
                  doneLabel = (LabelInstr *)IR::Opnd::AsRegOpnd(pOVar16);
                }
                IR::Instr::MoveArgs(callInstr,true);
                callInstr->m_opcode = CallIFixed;
                dispatchStartLabel =
                     &IR::LabelInstr::New(Label,callInstr->m_func,false)->super_Instr;
                pLStack_1d0 = IR::LabelInstr::New(Label,callInstr->m_func,false);
                IR::Instr::InsertBefore(callInstr,&pLStack_1d0->super_Instr);
                for (inlineeStartLabel._4_4_ = 0;
                    inlineeStartLabel._4_4_ < cachedFixedInlineeCount_00;
                    inlineeStartLabel._4_4_ = inlineeStartLabel._4_4_ + 1) {
                  constMethodValueOpnd =
                       (AddrOpnd *)IR::LabelInstr::New(Label,callInstr->m_func,false);
                  IR::Instr::InsertBefore(callInstr,(Instr *)constMethodValueOpnd);
                  iVar20 = IR::PropertySymOpnd::GetFieldValue(this_01,inlineeStartLabel._4_4_);
                  local_1e8 = IR::AddrOpnd::New(iVar20,AddrOpndKindDynamicVar,callInstr->m_func,
                                                false,(Var)0x0);
                  local_1e8->field_0x28 = local_1e8->field_0x28 & 0xfd | 2;
                  pFVar21 = IR::PropertySymOpnd::GetFixedFieldInfoArray(this_01);
                  pLVar4 = doneLabel;
                  pAVar3 = local_1e8;
                  local_1e8->m_metadata = pFVar21 + inlineeStartLabel._4_4_;
                  pFVar10 = inlineesDataArray[(ulong)inlineeStartLabel._4_4_ - 1];
                  inlineeRuntimeData =
                       FunctionJITTimeInfo::GetRuntimeInfo
                                 (inlineesDataArray[(ulong)inlineeStartLabel._4_4_ - 1]);
                  InsertOneInlinee(this,callInstr,(RegOpnd *)pLVar4,&pAVar3->super_Opnd,pFVar10,
                                   inlineeRuntimeData,(LabelInstr *)dispatchStartLabel,symCallerThis
                                   ,(bool)(typeId._3_1_ & 1),recursiveInlineDepth);
                  while (bVar5 = FixedFieldInfo::NextHasSameFixedField
                                           (fixedFunctionInfoArray_00 + inlineeStartLabel._4_4_),
                        pIVar8 = propertyGuardCheckInstr, pLVar4 = pLStack_1d0,
                        pAVar3 = constMethodValueOpnd, bVar5) {
                    local_1f0.t = (Type)IR::PropertySymOpnd::GetType
                                                  (this_01,inlineeStartLabel._4_4_);
                    pJVar23 = JITTypeHolderBase<void>::operator->(&local_1f0);
                    iVar20 = JITType::GetAddr(pJVar23);
                    pAVar24 = IR::AddrOpnd::New(iVar20,AddrOpndKindDynamicType,
                                                (pLStack_1d0->super_Instr).m_func,false,(Var)0x0);
                    pBVar25 = IR::BranchInstr::New
                                        (BrAddr_A,(LabelInstr *)pAVar3,(Opnd *)pIVar8,
                                         &pAVar24->super_Opnd,(pLStack_1d0->super_Instr).m_func);
                    IR::Instr::InsertBefore(&pLVar4->super_Instr,&pBVar25->super_Instr);
                    pFVar1 = this->topFunc;
                    local_1f8 = (Type)IR::PropertySymOpnd::GetType(this_01,inlineeStartLabel._4_4_);
                    Func::PinTypeRef(pFVar1,local_1f8);
                    inlineeStartLabel._4_4_ = inlineeStartLabel._4_4_ + 1;
                  }
                  local_200.t = (Type)IR::PropertySymOpnd::GetType(this_01,inlineeStartLabel._4_4_);
                  pJVar23 = JITTypeHolderBase<void>::operator->(&local_200);
                  iVar20 = JITType::GetAddr(pJVar23);
                  pAVar24 = IR::AddrOpnd::New(iVar20,AddrOpndKindDynamicType,
                                              (pLStack_1d0->super_Instr).m_func,false,(Var)0x0);
                  pBVar25 = IR::BranchInstr::New
                                      (BrAddr_A,(LabelInstr *)pAVar3,(Opnd *)pIVar8,
                                       &pAVar24->super_Opnd,(pLStack_1d0->super_Instr).m_func);
                  IR::Instr::InsertBefore(&pLVar4->super_Instr,&pBVar25->super_Instr);
                  pFVar1 = this->topFunc;
                  typeRef = IR::PropertySymOpnd::GetType(this_01,inlineeStartLabel._4_4_);
                  Func::PinTypeRef(pFVar1,typeRef.t);
                }
                IR::Instr::Unlink(this_00);
                this_00->m_opcode = LdMethodFldPolyInlineMiss;
                if (cachedFixedInlineeCount_00 == 0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 1;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                     ,0x3e3,"(cachedFixedInlineeCount > 0)",
                                     "cachedFixedInlineeCount > 0");
                  if (!bVar5) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 0;
                }
                CompletePolymorphicInlining
                          (this,callInstr,(RegOpnd *)doneLabel,(LabelInstr *)dispatchStartLabel,
                           &pLStack_1d0->super_Instr,this_00,
                           BailOutOnFailedPolymorphicInlineTypeCheck);
                Func::SetHasInlinee(this->topFunc);
                InsertStatementBoundary(this,(Instr *)this_local);
                InsertStatementBoundary(this,this_00);
                return (Instr *)this_local;
              }
              if ((inlineesDataArray[(ulong)i_1 - 1] == (FunctionJITTimeInfo *)0x0) ||
                 (bVar5 = FunctionJITTimeInfo::HasBody(inlineesDataArray[(ulong)i_1 - 1]), !bVar5))
              break;
              pJVar11 = FunctionJITTimeInfo::GetBody(inlineesDataArray[(ulong)i_1 - 1]);
              if (pJVar11 != (JITTimeFunctionBody *)0x0) {
                iVar20 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineesDataArray[(ulong)i_1 - 1])
                ;
                pFVar21 = IR::PropertySymOpnd::GetFixedFunction(this_01,i_1);
                iVar22 = FixedFieldInfo::GetFuncInfoAddr(pFVar21);
                if (iVar20 != iVar22) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 1;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                     ,0x369,"(false)",
                                     "inlineesDataArray and fixedfunctionInfoArray should be aligned with each other at this point"
                                    );
                  if (!bVar5) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 0;
                }
              }
              while (bVar5 = FixedFieldInfo::NextHasSameFixedField(fixedFunctionInfoArray_00 + i_1),
                    bVar5) {
                i_1 = i_1 + 1;
              }
              i_1 = i_1 + 1;
            }
            bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
            if (bVar5) {
              pJVar11 = FunctionJITTimeInfo::GetBody(inlinerData);
              pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
              pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_b8)
              ;
              Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: One of the inlinees doesn\'t have the corresponding object/prototype\'s type cached\tCaller: %s (%s)\n"
                            ,pcVar12,pcVar13);
              Output::Flush();
            }
            pIVar8 = InlinePolymorphicFunction
                               (this,callInstr,inlinerData,symCallerThis,profileId,pIsInlined,
                                recursiveInlineDepth,true);
            return pIVar8;
          }
        }
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
        if (bVar5) {
          pJVar11 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pIVar8);
          pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
          pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                              ((FunctionJITTimeInfo *)pIVar8,(wchar (*) [42])local_b8);
          pJVar11 = FunctionJITTimeInfo::GetBody(inlinerData);
          pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
          pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_118);
          Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: Did not find property sym operand for the method load Inlinee: %s (%s):\tCaller: %s (%s)\n"
                        ,pcVar12,pcVar13,pcVar14,pcVar15);
          Output::Flush();
        }
        this_local = (Inline *)
                     InlinePolymorphicFunction
                               (this,callInstr,inlinerData,symCallerThis,profileId,pIsInlined,
                                recursiveInlineDepth,true);
      }
      else {
        this_local = (Inline *)
                     InlinePolymorphicFunction
                               (this,callInstr,inlinerData,symCallerThis,profileId,pIsInlined,
                                recursiveInlineDepth,true);
      }
    }
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
Inline::InlinePolymorphicFunctionUsingFixedMethods(IR::Instr *callInstr, const FunctionJITTimeInfo * inlinerData, const StackSym *symCallerThis, const Js::ProfileId profileId, IR::PropertySymOpnd* methodValueOpnd, bool* pIsInlined, uint recursiveInlineDepth)
{
    IR::Instr* instrNext = callInstr->m_next;
    *pIsInlined = false;

    const FunctionJITTimeInfo* inlineeJitTimeData = inlinerData->GetInlinee(profileId);
    AnalysisAssert(inlineeJitTimeData);

#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    // Abort conditions:
    if(!inlineeJitTimeData->GetNext())
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                 inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                 inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        // There are no multiple codegen jit-time data allocated for this call site, not sure how is this possible, abort
        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
        return instrNext;
    }

    // arguments exceed MaxInlineeArgoutCount
    if (callInstr->GetSrc2() &&
        callInstr->GetSrc2()->IsSymOpnd() &&
        callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
    {
        // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo. Although
        // InliningDecider already checks for this, the check is against profile data that may not be accurate since profile
        // data matching does not take into account some types of changes to source code. Need to check this again with current
        // information.
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"),
            inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer) , callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum(),
            Js::InlineeCallInfo::MaxInlineeArgoutCount, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
        return instrNext;
    }

    uint inlineeCount = 0;
    const FunctionJITTimeInfo * tmpInlineeJitTimeData = inlineeJitTimeData;
    while(tmpInlineeJitTimeData)
    {
        inlineeCount++;
        tmpInlineeJitTimeData = tmpInlineeJitTimeData->GetNext();
    }

    // Inlinee count too small (<2) or too large (>4)
    if (inlineeCount < 2 || inlineeCount > Js::DynamicProfileInfo::maxPolymorphicInliningSize)
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large: InlineeCount %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
        return instrNext;
    }

    *pIsInlined = true;

    IR::Instr* tmpInstr = callInstr->m_prev;
    while (tmpInstr->m_opcode != Js::OpCode::StartCall)
    {
        if ((tmpInstr->m_opcode != Js::OpCode::ArgOut_A) && (tmpInstr->m_opcode != Js::OpCode::Ld_A))
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ArgOuts may have side effects Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
            return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
        }
        tmpInstr = tmpInstr->m_prev;
    }

    StackSym* methodValueSym = callInstr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym();
    if (!methodValueSym->IsSingleDef())
    {
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    IR::Instr* ldMethodFldInstr = methodValueSym->GetInstrDef();
    if (!(ldMethodFldInstr->GetSrc1()->IsSymOpnd() && ldMethodFldInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()))
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: Did not find property sym operand for the method load Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    IR::PropertySymOpnd* methodPropertyOpnd = ldMethodFldInstr->GetSrc1()->AsPropertySymOpnd();
    if (!methodPropertyOpnd->HasObjTypeSpecFldInfo())
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no ObjTypeSpecFldInfo to get Fixed Methods from Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    if (!methodPropertyOpnd->HasFixedValue())
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ObjTypeSpecFldInfo doesn't have Fixed Methods for one or some of the inlinees Inlinee: %s (%s):\tCaller: %s (%s)\n"),

                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    uint16 cachedFixedInlineeCount = methodPropertyOpnd->GetFixedFieldCount();
    if (cachedFixedInlineeCount < 2)
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: fixed function count too less %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    cachedFixedInlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    FixedFieldInfo* fixedFunctionInfoArray = methodPropertyOpnd->GetFixedFieldInfoArray();

    // It might so be the case that two objects of different types call the same function (body), for e.g., if they share the prototype on which the function is defined.
    uint uniqueFixedFunctionCount = HandleDifferentTypesSameFunction(fixedFunctionInfoArray, cachedFixedInlineeCount);

    if (uniqueFixedFunctionCount != inlineeCount)
    {
        // inlineeCount obtained from the inlineeJitTimeData is more accurate than cached number of fixed methods for inlinees.
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: cached fixed function count (%d) doesn't match inlinee count (%d); (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    uniqueFixedFunctionCount, inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    Assert(cachedFixedInlineeCount <= Js::DynamicProfileInfo::maxPolymorphicInliningSize);
    const FunctionJITTimeInfo* inlineesDataArray[Js::DynamicProfileInfo::maxPolymorphicInliningSize] = {};

    FillInlineesDataArrayUsingFixedMethods(inlineeJitTimeData, inlineesDataArray, Js::DynamicProfileInfo::maxPolymorphicInliningSize, fixedFunctionInfoArray, cachedFixedInlineeCount);

    for (uint i = 0; i < cachedFixedInlineeCount; i++)
    {
        if(!inlineesDataArray[i] || !inlineesDataArray[i]->HasBody())
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: One of the inlinees doesn't have the corresponding object/prototype's type cached\tCaller: %s (%s)\n"),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
            return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
        }
#if DBG
        if(inlineesDataArray[i]->GetBody() && inlineesDataArray[i]->GetFunctionInfoAddr() != methodPropertyOpnd->GetFixedFunction(i)->GetFuncInfoAddr())
        {
            AssertMsg(false, "inlineesDataArray and fixedfunctionInfoArray should be aligned with each other at this point");
        }
#endif
        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            i++;
        }
    }

    bool safeThis = true; // Eliminate CheckThis for inlining.
    for (uint i = 0; i < cachedFixedInlineeCount; i++)
    {
        if (!methodPropertyOpnd->GetFieldValue(i))
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no fixed method for one of the inlinees; Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineesDataArray[i]->GetBody()->GetDisplayName(), inlineesDataArray[i]->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
            return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
        }
        if (i == 0)
        {
            // Do all the general, non-function-object-specific checks just once.
            if (!TryOptimizeCallInstrWithFixedMethod(callInstr, inlineesDataArray[i], true, false, false, true /*isInlined*/, safeThis, true /*dontOptimizeJustCheck*/, i))
            {
                POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: can't optimize using Fixed Methods %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
                return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
            }
        }
        else
        {
            if (methodPropertyOpnd->GetFixedFunction(i) &&
                methodPropertyOpnd->GetFixedFunction(i)->GetFuncInfoAddr() != inlineesDataArray[i]->GetFunctionInfoAddr())
            {
                POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: can't optimize using Fixed Methods %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
                return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth,  true);
            }
        }
        Js::TypeId typeId = methodPropertyOpnd->GetTypeId(i);
        if(!(typeId > Js::TypeIds_LastJavascriptPrimitiveType && typeId <= Js::TypeIds_LastTrueJavascriptObjectType))
        {
            // Don't eliminate CheckThis if it cannot be done for any one of the inlinees
            safeThis = false;
        }
        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            i++;
        }
    }

    Assert(methodPropertyOpnd->IsPoly());

    // emit property guard check for the method load, and load type
    IR::RegOpnd *typeOpnd = IR::RegOpnd::New(TyVar, callInstr->m_func);
    IR::Instr* propertyGuardCheckInstr = IR::Instr::New(Js::OpCode::CheckPropertyGuardAndLoadType, typeOpnd, ldMethodFldInstr->GetSrc1(), callInstr->m_func);
    ldMethodFldInstr->InsertBefore(propertyGuardCheckInstr);
    propertyGuardCheckInstr->SetByteCodeOffset(ldMethodFldInstr);
    propertyGuardCheckInstr = propertyGuardCheckInstr->ConvertToBailOutInstr(ldMethodFldInstr, IR::BailOutFailedFixedFieldCheck);

    POLYMORPHIC_INLINE_TESTTRACE(_u("------------------------------------------------\n"));
    for (uint i = 0; i < cachedFixedInlineeCount; i++)
    {
        JITTimeFunctionBody *inlineeFunctionBody = inlineesDataArray[i]->GetBody();
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Start inlining: \tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeFunctionBody->GetDisplayName(), inlineesDataArray[i]->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            i++;
        }
    }
    POLYMORPHIC_INLINE_TESTTRACE(_u("------------------------------------------------\n"));

    IR::RegOpnd * returnValueOpnd;
    if (callInstr->GetDst())
    {
        returnValueOpnd = callInstr->UnlinkDst()->AsRegOpnd();
    }
    else
    {
        returnValueOpnd = nullptr;
    }

    callInstr->MoveArgs(/*generateByteCodeCapture*/ true);

    callInstr->m_opcode = Js::OpCode::CallIFixed;

    // iterate over inlineesDataArray to emit each inlinee
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, false);
    IR::Instr* dispatchStartLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, false);
    callInstr->InsertBefore(dispatchStartLabel);
    for(uint i=0; i < cachedFixedInlineeCount; i++)
    {
        IR::LabelInstr* inlineeStartLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func);
        callInstr->InsertBefore(inlineeStartLabel);

        IR::AddrOpnd * constMethodValueOpnd = IR::AddrOpnd::New(methodPropertyOpnd->GetFieldValue(i), IR::AddrOpndKind::AddrOpndKindDynamicVar, callInstr->m_func);
        constMethodValueOpnd->m_isFunction = true;
        constMethodValueOpnd->m_metadata = &methodPropertyOpnd->GetFixedFieldInfoArray()[i];

        InsertOneInlinee(callInstr, returnValueOpnd, constMethodValueOpnd, inlineesDataArray[i], inlineesDataArray[i]->GetRuntimeInfo(), doneLabel, symCallerThis, safeThis, recursiveInlineDepth);
        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            dispatchStartLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::BrAddr_A, inlineeStartLabel, typeOpnd, IR::AddrOpnd::New(methodPropertyOpnd->GetType(i)->GetAddr(),
                IR::AddrOpndKindDynamicType, dispatchStartLabel->m_func), dispatchStartLabel->m_func));
            this->topFunc->PinTypeRef(methodPropertyOpnd->GetType(i).t); // Keep the types alive as the types may not be equivalent and, hence, won't be kept alive by EquivalentTypeCache
            i++;
        }

        dispatchStartLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::BrAddr_A, inlineeStartLabel,
            typeOpnd, IR::AddrOpnd::New(methodPropertyOpnd->GetType(i)->GetAddr(), IR::AddrOpndKindDynamicType, dispatchStartLabel->m_func), dispatchStartLabel->m_func));
        this->topFunc->PinTypeRef(methodPropertyOpnd->GetType(i).t); // Keep the types alive as the types may not be equivalent and, hence, won't be kept alive by EquivalentTypeCache
    }

    ldMethodFldInstr->Unlink();
    ldMethodFldInstr->m_opcode = Js::OpCode::LdMethodFldPolyInlineMiss;
    Assert(cachedFixedInlineeCount > 0);
    CompletePolymorphicInlining(callInstr, returnValueOpnd, doneLabel, dispatchStartLabel, ldMethodFldInstr, IR::BailOutOnFailedPolymorphicInlineTypeCheck);

    this->topFunc->SetHasInlinee();
    InsertStatementBoundary(instrNext);
    InsertStatementBoundary(ldMethodFldInstr);

    return instrNext;
}